

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfGenericOutputFile.cpp
# Opt level: O3

void __thiscall
Imf_3_4::GenericOutputFile::writeMagicNumberAndVersionField
          (GenericOutputFile *this,OStream *os,Header *headers,int parts)

{
  size_t __n;
  bool bVar1;
  undefined4 in_EAX;
  int iVar2;
  string *psVar3;
  ushort uVar4;
  ushort uVar5;
  ulong uVar6;
  uint local_38;
  undefined4 local_34;
  
  _local_38 = CONCAT44(0x1312f76,in_EAX);
  (*os->_vptr_OStream[2])(os,&local_34,4);
  if (parts == 1) {
    psVar3 = Header::type_abi_cxx11_(headers);
    __n = psVar3->_M_string_length;
    uVar5 = 2;
    if (__n == _DAT_001e7d40) {
      if (__n != 0) {
        iVar2 = bcmp((psVar3->_M_dataplus)._M_p,TILEDIMAGE_abi_cxx11_,__n);
        if (iVar2 != 0) goto LAB_00179947;
      }
      uVar5 = 0x202;
    }
  }
  else {
    uVar4 = 0x1002;
    uVar5 = 0x1002;
    if (parts < 1) goto LAB_00179996;
  }
LAB_00179947:
  uVar4 = uVar5;
  uVar6 = (ulong)(uint)parts;
  do {
    bVar1 = usesLongNames(headers);
    uVar5 = uVar4 | 0x400;
    if (!bVar1) {
      uVar5 = uVar4;
    }
    bVar1 = Header::hasType(headers);
    uVar4 = uVar5;
    if (bVar1) {
      psVar3 = Header::type_abi_cxx11_(headers);
      bVar1 = isImage(psVar3);
      if (!bVar1) {
        uVar4 = uVar5 | 0x800;
      }
    }
    headers = headers + 1;
    uVar6 = uVar6 - 1;
  } while (uVar6 != 0);
LAB_00179996:
  local_38 = (uint)uVar4;
  (*os->_vptr_OStream[2])(os,&local_38,4);
  return;
}

Assistant:

void
GenericOutputFile::writeMagicNumberAndVersionField (
    OPENEXR_IMF_INTERNAL_NAMESPACE::OStream& os,
    const Header*                            headers,
    int                                      parts)
{
    OPENEXR_IMF_INTERNAL_NAMESPACE::Xdr::write<
        OPENEXR_IMF_INTERNAL_NAMESPACE::StreamIO> (os, MAGIC);

    int version = EXR_VERSION;

    if (parts == 1)
    {
        if (headers[0].type () == TILEDIMAGE) version |= TILED_FLAG;
    }
    else { version |= MULTI_PART_FILE_FLAG; }

    for (int i = 0; i < parts; i++)
    {
        if (usesLongNames (headers[i])) version |= LONG_NAMES_FLAG;

        if (headers[i].hasType () && isImage (headers[i].type ()) == false)
            version |= NON_IMAGE_FLAG;
    }

    OPENEXR_IMF_INTERNAL_NAMESPACE::Xdr::write<
        OPENEXR_IMF_INTERNAL_NAMESPACE::StreamIO> (os, version);
}